

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalReference.cpp
# Opt level: O1

HierarchicalReference * __thiscall
slang::ast::HierarchicalReference::join
          (HierarchicalReference *this,Compilation *compilation,HierarchicalReference *other)

{
  __normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
  first;
  int iVar1;
  undefined4 extraout_var;
  HierarchicalReference *pHVar2;
  EVP_PKEY_CTX *src;
  __normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
  first_00;
  size_t sVar3;
  SmallVector<slang::ast::HierarchicalReference::Element,_2UL> newPath;
  HierarchicalReference local_a8;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> local_78;
  
  local_a8.path._M_ptr = (pointer)0x0;
  local_a8.path._M_extent._M_extent_value = 0;
  local_a8.target = other->target;
  local_a8.expr = other->expr;
  local_a8.upwardCount = this->upwardCount;
  first_00._M_current = (other->path)._M_ptr;
  sVar3 = (other->path)._M_extent._M_extent_value;
  if ((sVar3 != 0) && ((((first_00._M_current)->symbol).ptr)->kind == InterfacePort)) {
    sVar3 = sVar3 - 1;
    first_00._M_current = first_00._M_current + 1;
  }
  local_78.len = 0;
  local_78.cap = 2;
  first._M_current = (this->path)._M_ptr;
  local_78.data_ = (pointer)local_78.firstElement;
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::
  append<__gnu_cxx::__normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>_>
            (&local_78,first,first._M_current + (this->path)._M_extent._M_extent_value);
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::
  append<__gnu_cxx::__normal_iterator<const_slang::ast::HierarchicalReference::Element_*,_std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>_>
            (&local_78,first_00,first_00._M_current + sVar3);
  iVar1 = SmallVectorBase<slang::ast::HierarchicalReference::Element>::copy
                    (&local_78,(EVP_PKEY_CTX *)compilation,src);
  local_a8.path._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  pHVar2 = BumpAllocator::
           emplace<slang::ast::HierarchicalReference,slang::ast::HierarchicalReference&>
                     (&compilation->super_BumpAllocator,&local_a8);
  if (local_78.data_ != (pointer)local_78.firstElement) {
    operator_delete(local_78.data_);
  }
  return pHVar2;
}

Assistant:

const HierarchicalReference& HierarchicalReference::join(Compilation& compilation,
                                                         const HierarchicalReference& other) const {
    HierarchicalReference result;
    result.target = other.target;
    result.expr = other.expr;
    result.upwardCount = upwardCount;

    auto otherPath = other.path;
    if (other.isViaIfacePort())
        otherPath = otherPath.subspan(1);

    SmallVector<Element> newPath;
    newPath.append_range(path);
    newPath.append_range(otherPath);
    result.path = newPath.copy(compilation);

    return *compilation.emplace<HierarchicalReference>(result);
}